

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_0::CWriter::WriteFuncDeclaration
          (CWriter *this,FuncDeclaration *decl,string *name)

{
  ulong uVar1;
  ResultType local_28;
  
  local_28.types = &(decl->sig).result_types;
  Write(this,&local_28);
  WriteData(this," ",1);
  WriteData(this,(name->_M_dataplus)._M_p,name->_M_string_length);
  WriteData(this,"(",1);
  if (((long)(decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(decl->sig).param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
             _M_impl.super__Vector_impl_data._M_start & 0x3fffffffcU) == 0) {
    WriteData(this,"void",4);
  }
  else if (((long)(decl->sig).param_types.
                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(decl->sig).param_types.
                  super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                  super__Vector_impl_data._M_start & 0x3fffffffcU) != 0) {
    uVar1 = 0;
    do {
      if (uVar1 != 0) {
        WriteData(this,", ",2);
      }
      Write(this,(Type)(decl->sig).param_types.
                       super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar1].enum_);
      uVar1 = uVar1 + 1;
    } while (uVar1 < ((ulong)((long)(decl->sig).param_types.
                                    super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(decl->sig).param_types.
                                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2 & 0xffffffff));
  }
  WriteData(this,")",1);
  return;
}

Assistant:

void CWriter::WriteFuncDeclaration(const FuncDeclaration& decl,
                                   const std::string& name) {
  Write(ResultType(decl.sig.result_types), " ", name, "(");
  if (decl.GetNumParams() == 0) {
    Write("void");
  } else {
    for (Index i = 0; i < decl.GetNumParams(); ++i) {
      if (i != 0)
        Write(", ");
      Write(decl.GetParamType(i));
    }
  }
  Write(")");
}